

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O2

Option * __thiscall CLI::Option::multi_option_policy(Option *this,MultiOptionPolicy value)

{
  MultiOptionPolicy MVar1;
  
  MVar1 = (this->super_OptionBase<CLI::Option>).multi_option_policy_;
  if (MVar1 != value) {
    if (((MVar1 == Throw) && (this->expected_max_ == 0x20000000)) && (1 < this->expected_min_)) {
      this->expected_max_ = this->expected_min_;
    }
    (this->super_OptionBase<CLI::Option>).multi_option_policy_ = value;
    this->current_option_state_ = parsing;
  }
  return this;
}

Assistant:

CLI11_INLINE Option *Option::multi_option_policy(MultiOptionPolicy value) {
    if(value != multi_option_policy_) {
        if(multi_option_policy_ == MultiOptionPolicy::Throw && expected_max_ == detail::expected_max_vector_size &&
           expected_min_ > 1) {  // this bizarre condition is to maintain backwards compatibility
                                 // with the previous behavior of expected_ with vectors
            expected_max_ = expected_min_;
        }
        multi_option_policy_ = value;
        current_option_state_ = option_state::parsing;
    }
    return this;
}